

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O0

void __thiscall
ft::set<int,_ft::greater<int>,_ft::allocator<int>_>::erase
          (set<int,_ft::greater<int>,_ft::allocator<int>_> *this,iterator *position)

{
  bool bVar1;
  treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> local_30;
  iterator *local_18;
  iterator *position_local;
  set<int,_ft::greater<int>,_ft::allocator<int>_> *this_local;
  
  local_18 = position;
  position_local = (iterator *)this;
  treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::treeIterator(&local_30,position);
  treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>::BSTerase
            ((treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_> *)this,&local_30);
  treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::~treeIterator(&local_30);
  (this->super_setBase<int,_ft::greater<int>,_ft::allocator<int>_>).
  super_treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>.m_size =
       (this->super_setBase<int,_ft::greater<int>,_ft::allocator<int>_>).
       super_treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>.m_size - 1;
  bVar1 = treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>::empty
                    ((treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_> *)this);
  if (bVar1) {
    treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>::treeInit
              ((treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_> *)this);
  }
  return;
}

Assistant:

void	erase(iterator position)
	{
		this->BSTerase(position);
		--this->m_size;
		if (this->empty()) {
			this->treeInit();
		}
	}